

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O2

StringRef llvm::dwarf::InlineCodeString(uint Code)

{
  char *pcVar1;
  size_t sVar2;
  StringRef SVar3;
  
  pcVar1 = (char *)0x0;
  sVar2 = 0;
  if (Code < 4) {
    pcVar1 = &DAT_00e75a54 + *(int *)(&DAT_00e75a54 + (ulong)Code * 4);
    sVar2 = *(size_t *)(&DAT_00e79288 + (ulong)Code * 8);
  }
  SVar3.Length = sVar2;
  SVar3.Data = pcVar1;
  return SVar3;
}

Assistant:

StringRef llvm::dwarf::InlineCodeString(unsigned Code) {
  switch (Code) {
  case DW_INL_not_inlined:
    return "DW_INL_not_inlined";
  case DW_INL_inlined:
    return "DW_INL_inlined";
  case DW_INL_declared_not_inlined:
    return "DW_INL_declared_not_inlined";
  case DW_INL_declared_inlined:
    return "DW_INL_declared_inlined";
  }
  return StringRef();
}